

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::AssetPath> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::AssetPath>
          (optional<tinyusdz::value::AssetPath> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::AssetPath> local_60;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::value::AssetPath>(&local_60,&this->_value,false);
    nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::
    optional<tinyusdz::value::AssetPath,_0>(__return_storage_ptr__,&local_60);
    nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::~optional(&local_60);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined8 *)&__return_storage_ptr__->contained = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }